

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UInt32Math.h
# Opt level: O2

uint32 UInt32Math::MulAdd<3u,18u>(uint32 left)

{
  if (left < 0x55555550) {
    return left * 3 + 0x12;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

static uint32 MulAdd(uint32 left, __inout Func& overflowFn)
    {
        //
        // The result will overflow if (left*mul)+add > UINT_MAX
        // Rearranging, this becomes: left > (UINT_MAX - add) / mul
        //
        // If add and mul are compile-time constants then LTCG will collapse
        // this to a simple constant comparison.
        //
        if( left > ((UINT_MAX - add) / mul) )
        {
            overflowFn();
        }

        // When add and mul are small constants, the compiler is
        // typically able to use the LEA instruction here.
        return (left * mul) + add;
    }